

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O0

void m68k_op_divu_16_aw(void)

{
  uint uVar1;
  uint uVar2;
  uint *puVar3;
  uint remainder;
  uint quotient;
  uint src;
  uint *r_dst;
  
  puVar3 = m68ki_cpu.dar + (m68ki_cpu.ir >> 9 & 7);
  uVar1 = OPER_AW_16();
  if (uVar1 == 0) {
    m68ki_exception_trap(5);
  }
  else {
    uVar2 = *puVar3 / uVar1;
    if (uVar2 < 0x10000) {
      m68ki_cpu.n_flag = uVar2 >> 8;
      m68ki_cpu.v_flag = 0;
      m68ki_cpu.c_flag = 0;
      m68ki_cpu.not_z_flag = uVar2;
      *puVar3 = uVar2 & 0xffff | *puVar3 % uVar1 << 0x10;
    }
    else {
      m68ki_cpu.v_flag = 0x80;
    }
  }
  return;
}

Assistant:

static void m68k_op_divu_16_aw(void)
{
	uint* r_dst = &DX;
	uint src = OPER_AW_16();

	if(src != 0)
	{
		uint quotient = *r_dst / src;
		uint remainder = *r_dst % src;

		if(quotient < 0x10000)
		{
			FLAG_Z = quotient;
			FLAG_N = NFLAG_16(quotient);
			FLAG_V = VFLAG_CLEAR;
			FLAG_C = CFLAG_CLEAR;
			*r_dst = MASK_OUT_ABOVE_32(MASK_OUT_ABOVE_16(quotient) | (remainder << 16));
			return;
		}
		FLAG_V = VFLAG_SET;
		return;
	}
	m68ki_exception_trap(EXCEPTION_ZERO_DIVIDE);
}